

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

longlong __thiscall fmt::v8::file::size(file *this)

{
  int iVar1;
  undefined8 uVar2;
  uint *puVar3;
  format_string<> fmt;
  undefined1 local_a0 [8];
  Stat file_stat;
  file *this_local;
  
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)this;
  memset(local_a0,0,0x90);
  iVar1 = fstat(this->fd_,(stat *)local_a0);
  if (iVar1 == -1) {
    uVar2 = __cxa_allocate_exception(0x20);
    puVar3 = (uint *)__errno_location();
    fmt.str_.data_ = (char *)(ulong)*puVar3;
    fmt.str_.size_ = (size_t)"cannot get file attributes";
    system_error<>((int)uVar2,fmt);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return file_stat.st_rdev;
}

Assistant:

long long file::size() const {
#  ifdef _WIN32
  // Use GetFileSize instead of GetFileSizeEx for the case when _WIN32_WINNT
  // is less than 0x0500 as is the case with some default MinGW builds.
  // Both functions support large file sizes.
  DWORD size_upper = 0;
  HANDLE handle = reinterpret_cast<HANDLE>(_get_osfhandle(fd_));
  DWORD size_lower = FMT_SYSTEM(GetFileSize(handle, &size_upper));
  if (size_lower == INVALID_FILE_SIZE) {
    DWORD error = GetLastError();
    if (error != NO_ERROR)
      FMT_THROW(windows_error(GetLastError(), "cannot get file size"));
  }
  unsigned long long long_size = size_upper;
  return (long_size << sizeof(DWORD) * CHAR_BIT) | size_lower;
#  else
  using Stat = struct stat;
  Stat file_stat = Stat();
  if (FMT_POSIX_CALL(fstat(fd_, &file_stat)) == -1)
    FMT_THROW(system_error(errno, "cannot get file attributes"));
  static_assert(sizeof(long long) >= sizeof(file_stat.st_size),
                "return type of file::size is not large enough");
  return file_stat.st_size;
#  endif
}